

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cpp
# Opt level: O0

void just_test_test_case_f_test_read_and_write_file(void)

{
  string local_b0;
  allocator<char> local_89;
  string local_88;
  assert_equal local_68;
  allocator<char> local_29;
  string local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"foo bar",&local_29);
  write_file(&temp_filename_abi_cxx11_,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/process/test/test_util.cpp"
             ,&local_89);
  just::test::assert_equal::assert_equal(&local_68,&local_88,0x46);
  read_file(&local_b0,&temp_filename_abi_cxx11_);
  just::test::assert_equal::operator()(&local_68,"foo bar",&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  just::test::assert_equal::~assert_equal(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

JUST_TEST_CASE(test_read_and_write_file)
{
  write_file(temp_filename, "foo bar");
  JUST_ASSERT_EQUAL("foo bar", read_file(temp_filename));
}